

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O3

String * __thiscall
kj::str<char_const(&)[16],unsigned_char&>
          (String *__return_storage_ptr__,kj *this,char (*params) [16],uchar *params_1)

{
  CappedArray<char,_5UL> CVar1;
  ArrayPtr<const_char> local_40;
  kj *local_30;
  size_t local_28;
  
  local_28 = strlen((char *)this);
  local_30 = this;
  CVar1 = _::Stringifier::operator*((Stringifier *)&_::STR,(*params)[0]);
  local_40.ptr = (char *)CVar1.currentSize;
  local_40.size_._0_4_ = CVar1.content._0_4_;
  local_40.size_._4_1_ = CVar1.content[4];
  _::concat<kj::ArrayPtr<char_const>,kj::CappedArray<char,5ul>>
            (__return_storage_ptr__,(_ *)&local_30,&local_40,(CappedArray<char,_5UL> *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}